

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpreadwrite.c
# Opt level: O0

int http_Download(char *url_str,int timeout_secs,char **document,size_t *doc_length,
                 char *content_type)

{
  size_t urlstrlen;
  http_header_t *phVar1;
  char *pcVar2;
  char *local_378;
  size_t url_str_len;
  membuffer request;
  size_t copy_len;
  memptr ctype;
  size_t hostlen;
  size_t msg_length;
  http_parser_t response;
  char *hoststr;
  char *entity_start;
  char *msg_start;
  uri_type url;
  int ret_code;
  char *content_type_local;
  size_t *doc_length_local;
  char **document_local;
  int timeout_secs_local;
  char *url_str_local;
  
  urlstrlen = strlen(url_str);
  UpnpPrintf(UPNP_INFO,HTTP,".upnp/src/genlib/net/http/httpreadwrite.c",0x354,"DOWNLOAD URL : %s\n",
             url_str);
  url.hostport.IPaddress.__ss_align._4_4_ = http_FixStrUrl(url_str,urlstrlen,(uri_type *)&msg_start)
  ;
  url_str_local._4_4_ = url.hostport.IPaddress.__ss_align._4_4_;
  if (url.hostport.IPaddress.__ss_align._4_4_ == 0) {
    membuffer_init((membuffer *)&url_str_len);
    url.hostport.IPaddress.__ss_align._4_4_ =
         get_hoststr(url_str,(char **)&response.scanner.entire_msg_loaded,&ctype.length);
    url_str_local._4_4_ = url.hostport.IPaddress.__ss_align._4_4_;
    if (url.hostport.IPaddress.__ss_align._4_4_ == 0) {
      UpnpPrintf(UPNP_INFO,HTTP,".upnp/src/genlib/net/http/httpreadwrite.c",0x364,
                 "HOSTNAME : %s Length : %zu\n",response.scanner._16_8_,ctype.length);
      url.hostport.IPaddress.__ss_align._4_4_ =
           http_MakeMessage((membuffer *)&url_str_len,1,1,"QsbcDCUc",2,url._24_8_,url.pathquery.buff
                            ,"HOST: ",response.scanner._16_8_,ctype.length);
      if (url.hostport.IPaddress.__ss_align._4_4_ == 0) {
        UpnpPrintf(UPNP_INFO,HTTP,".upnp/src/genlib/net/http/httpreadwrite.c",0x380,
                   "HTTP Buffer:\n%s\n----------END--------\n",url_str_len);
        url.hostport.IPaddress.__ss_align._4_4_ =
             http_RequestAndResponse
                       ((uri_type *)&msg_start,(char *)url_str_len,(size_t)request.buf,
                        HTTPMETHOD_GET,timeout_secs,(http_parser_t *)&msg_length);
        if (url.hostport.IPaddress.__ss_align._4_4_ == 0) {
          UpnpPrintf(UPNP_INFO,HTTP,".upnp/src/genlib/net/http/httpreadwrite.c",0x391,"Response\n");
          print_http_headers((http_message_t *)&msg_length);
          if (content_type != (char *)0x0) {
            phVar1 = httpmsg_find_hdr((http_message_t *)&msg_length,4,(memptr *)&copy_len);
            if (phVar1 == (http_header_t *)0x0) {
              *content_type = '\0';
            }
            else {
              if (ctype.buf < (char *)0xb3) {
                local_378 = ctype.buf;
              }
              else {
                local_378 = (char *)0xb3;
              }
              request.size_inc = (size_t)local_378;
              memcpy(content_type,(void *)copy_len,(size_t)local_378);
              content_type[request.size_inc] = '\0';
            }
          }
          *doc_length = (size_t)response.msg.entity.buf;
          if (response.msg.entity.buf == (char *)0x0) {
            *document = (char *)0x0;
          }
          else if (response.msg.uri.hostport.IPaddress.__ss_align._4_4_ == 200) {
            pcVar2 = membuffer_detach((membuffer *)&response.msg.entity.length);
            memmove(pcVar2,response.msg.headers.cmp_func,*doc_length + 1);
            pcVar2 = (char *)realloc(pcVar2,*doc_length + 1);
            *document = pcVar2;
            if (response.msg.msg.buf <= (char *)*doc_length) {
              __assert_fail("msg_length > *doc_length",".upnp/src/genlib/net/http/httpreadwrite.c",
                            0x3b4,"int http_Download(const char *, int, char **, size_t *, char *)")
              ;
            }
            if (*document == (char *)0x0) {
              __assert_fail("*document != NULL",".upnp/src/genlib/net/http/httpreadwrite.c",0x3b5,
                            "int http_Download(const char *, int, char **, size_t *, char *)");
            }
            if ((response.msg.msg.buf <= (char *)*doc_length) || (*document == (char *)0x0)) {
              UpnpPrintf(UPNP_INFO,HTTP,".upnp/src/genlib/net/http/httpreadwrite.c",0x3ba,
                         "msg_length(%zu) <= *doc_length(%zu) or document is NULL",
                         response.msg.msg.buf,*doc_length);
            }
          }
          if (response.msg.uri.hostport.IPaddress.__ss_align._4_4_ == 200) {
            url.hostport.IPaddress.__ss_align._4_4_ = 0;
          }
          else {
            url.hostport.IPaddress.__ss_align._4_4_ =
                 response.msg.uri.hostport.IPaddress.__ss_align._4_4_;
          }
          httpmsg_destroy((http_message_t *)&msg_length);
          membuffer_destroy((membuffer *)&url_str_len);
          url_str_local._4_4_ = url.hostport.IPaddress.__ss_align._4_4_;
        }
        else {
          httpmsg_destroy((http_message_t *)&msg_length);
          membuffer_destroy((membuffer *)&url_str_len);
          url_str_local._4_4_ = url.hostport.IPaddress.__ss_align._4_4_;
        }
      }
      else {
        UpnpPrintf(UPNP_INFO,HTTP,".upnp/src/genlib/net/http/httpreadwrite.c",0x378,
                   "HTTP Makemessage failed\n");
        membuffer_destroy((membuffer *)&url_str_len);
        url_str_local._4_4_ = url.hostport.IPaddress.__ss_align._4_4_;
      }
    }
  }
  return url_str_local._4_4_;
}

Assistant:

int http_Download(const char *url_str,
	int timeout_secs,
	char **document,
	size_t *doc_length,
	char *content_type)
{
	int ret_code;
	uri_type url;
	char *msg_start;
	char *entity_start;
	const char *hoststr;
	http_parser_t response;
	size_t msg_length;
	size_t hostlen;
	memptr ctype;
	size_t copy_len;
	membuffer request;
	size_t url_str_len;

	url_str_len = strlen(url_str);
	/*ret_code = parse_uri( (char*)url_str, url_str_len, &url ); */
	UpnpPrintf(UPNP_INFO,
		HTTP,
		__FILE__,
		__LINE__,
		"DOWNLOAD URL : %s\n",
		url_str);
	ret_code = http_FixStrUrl((char *)url_str, url_str_len, &url);
	if (ret_code != UPNP_E_SUCCESS) {
		return ret_code;
	}
	/* make msg */
	membuffer_init(&request);
	ret_code = get_hoststr(url_str, &hoststr, &hostlen);
	if (ret_code != UPNP_E_SUCCESS) {
		return ret_code;
	}
	UpnpPrintf(UPNP_INFO,
		HTTP,
		__FILE__,
		__LINE__,
		"HOSTNAME : %s Length : %" PRIzu "\n",
		hoststr,
		hostlen);
	ret_code = http_MakeMessage(&request,
		1,
		1,
		"Q"
		"s"
		"bcDCUc",
		HTTPMETHOD_GET,
		url.pathquery.buff,
		url.pathquery.size,
		"HOST: ",
		hoststr,
		hostlen);
	if (ret_code != 0) {
		UpnpPrintf(UPNP_INFO,
			HTTP,
			__FILE__,
			__LINE__,
			"HTTP Makemessage failed\n");
		membuffer_destroy(&request);
		return ret_code;
	}
	UpnpPrintf(UPNP_INFO,
		HTTP,
		__FILE__,
		__LINE__,
		"HTTP Buffer:\n%s\n"
		"----------END--------\n",
		request.buf);
	/* get doc msg */
	ret_code = http_RequestAndResponse(&url,
		request.buf,
		request.length,
		HTTPMETHOD_GET,
		timeout_secs,
		&response);

	if (ret_code != 0) {
		httpmsg_destroy(&response.msg);
		membuffer_destroy(&request);
		return ret_code;
	}
	UpnpPrintf(UPNP_INFO, HTTP, __FILE__, __LINE__, "Response\n");
	print_http_headers(&response.msg);
	/* optional content-type */
	if (content_type) {
		if (httpmsg_find_hdr(&response.msg, HDR_CONTENT_TYPE, &ctype) ==
			NULL) {
			*content_type = '\0'; /* no content-type */
		} else {
			/* safety */
			copy_len = ctype.length < LINE_SIZE - (size_t)1
					   ? ctype.length
					   : LINE_SIZE - (size_t)1;

			memcpy(content_type, ctype.buf, copy_len);
			content_type[copy_len] = '\0';
		}
	}
	/* extract doc from msg */
	if ((*doc_length = response.msg.entity.length) == (size_t)0) {
		/* 0-length msg */
		*document = NULL;
	} else if (response.msg.status_code == HTTP_OK) {
		/*LEAK_FIX_MK */
		/* copy entity */
		entity_start = response.msg.entity.buf; /* what we want */
		msg_length = response.msg.msg.length; /* save for posterity   */
		msg_start = membuffer_detach(&response.msg.msg); /* whole msg */
		/* move entity to the start; copy null-terminator too */
		memmove(msg_start, entity_start, *doc_length + (size_t)1);
		/* save mem for body only */
		*document = realloc(
			msg_start, *doc_length + (size_t)1); /*LEAK_FIX_MK */
		/* *document = Realloc( msg_start,msg_length, *doc_length + 1 );
		 * LEAK_FIX_MK */
		/* shrink can't fail */
		assert(msg_length > *doc_length);
		assert(*document != NULL);
		if (msg_length <= *doc_length || *document == NULL)
			UpnpPrintf(UPNP_INFO,
				HTTP,
				__FILE__,
				__LINE__,
				"msg_length(%" PRIzu ") <= *doc_length(%" PRIzu
				") or document is NULL",
				msg_length,
				*doc_length);
	}
	if (response.msg.status_code == HTTP_OK) {
		ret_code = 0; /* success */
	} else {
		/* server sent error msg (not requested doc) */
		ret_code = response.msg.status_code;
	}
	httpmsg_destroy(&response.msg);
	membuffer_destroy(&request);

	return ret_code;
}